

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O3

CONF_SECTION * NCONF_new_section(CONF *conf,char *section)

{
  int iVar1;
  CONF_SECTION *section_00;
  char *pcVar2;
  OPENSSL_STACK *pOVar3;
  void *old_data_void;
  CONF_SECTION *local_20;
  
  section_00 = (CONF_SECTION *)OPENSSL_malloc(0x10);
  if (section_00 != (CONF_SECTION *)0x0) {
    pcVar2 = OPENSSL_strdup(section);
    section_00->name = pcVar2;
    pOVar3 = OPENSSL_sk_new_null();
    section_00->values = (stack_st_CONF_VALUE *)pOVar3;
    if (pOVar3 != (OPENSSL_STACK *)0x0 && section_00->name != (char *)0x0) {
      local_20 = (CONF_SECTION *)0x0;
      iVar1 = OPENSSL_lh_insert((_LHASH *)conf->sections,&local_20,section_00,
                                lh_CONF_SECTION_call_hash_func,lh_CONF_SECTION_call_cmp_func);
      if (iVar1 != 0) {
        section_free(local_20);
        return section_00;
      }
    }
    section_free(section_00);
  }
  return (CONF_SECTION *)0x0;
}

Assistant:

static CONF_SECTION *NCONF_new_section(const CONF *conf, const char *section) {
  CONF_SECTION *s =
      reinterpret_cast<CONF_SECTION *>(OPENSSL_malloc(sizeof(CONF_SECTION)));
  if (!s) {
    return NULL;
  }
  s->name = OPENSSL_strdup(section);
  s->values = sk_CONF_VALUE_new_null();
  if (s->name == NULL || s->values == NULL) {
    goto err;
  }

  CONF_SECTION *old_section;
  if (!lh_CONF_SECTION_insert(conf->sections, &old_section, s)) {
    goto err;
  }
  section_free(old_section);
  return s;

err:
  section_free(s);
  return NULL;
}